

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O2

void wasm::LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
     ::doVisitLocalSet(RelevantLiveLocalsWalker *self,Expression **currp)

{
  BasicBlock *pBVar1;
  Expression *pEVar2;
  _Storage<wasm::Type,_true> _Var3;
  bool bVar4;
  LocalSet *this;
  Expression *pEVar5;
  Index *__args_1;
  optional<wasm::Type> type;
  Builder local_50;
  Block *local_48;
  Module *local_40;
  undefined8 local_38;
  Expression **local_30;
  Expression **currp_local;
  
  local_30 = currp;
  this = Expression::cast<wasm::LocalSet>(*currp);
  pBVar1 = (self->
           super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
           ).
           super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
           .currBasicBlock;
  if (pBVar1 == (BasicBlock *)0x0) {
    bVar4 = LocalSet::isTee(this);
    if (bVar4) {
      _Var3 = (_Storage<wasm::Type,_true>)
              (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id;
      local_48 = (Block *)this->value;
      if (_Var3 != (_Storage<wasm::Type,_true>)
                   (local_48->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                   type.id) {
        local_50.wasm =
             (self->
             super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             ).
             super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             .
             super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .currModule;
        local_40 = (Module *)&local_48;
        local_38 = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = _Var3;
        local_48 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_50,(initializer_list<wasm::Expression_*> *)&local_40,type);
      }
    }
    else {
      local_40 = (self->
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 ).
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .
                 super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .currModule;
      local_48 = (Block *)Builder::makeDrop((Builder *)&local_40,this->value);
    }
    *currp = (Expression *)local_48;
  }
  else {
    local_40 = (Module *)CONCAT44(local_40._4_4_,1);
    __args_1 = &this->index;
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               &(pBVar1->contents).actions,(What *)&local_40,__args_1,&local_30);
    pEVar2 = this->value;
    pEVar5 = pEVar2;
    if ((pEVar2->_id == LocalGetId) ||
       ((pEVar2->_id == IfId &&
        ((pEVar5 = (Expression *)pEVar2[1].type.id, pEVar5->_id == LocalGetId ||
         ((pEVar5 = *(Expression **)(pEVar2 + 2), pEVar5 != (Expression *)0x0 &&
          (pEVar5->_id == LocalGetId)))))))) {
      addCopy(&self->
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ,*__args_1,*(Index *)(pEVar5 + 1));
      addCopy(&self->
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ,*__args_1,*(Index *)(pEVar5 + 1));
    }
  }
  return;
}

Assistant:

static void doVisitLocalSet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalSet>();
    // if in unreachable code, we don't need the tee (but might need the value,
    // if it has side effects)
    if (!self->currBasicBlock) {
      if (curr->isTee()) {
        // We can remove the tee, but must leave something of the exact same
        // type.
        auto originalType = curr->type;
        if (originalType != curr->value->type) {
          *currp =
            Builder(*self->getModule()).makeBlock({curr->value}, originalType);
        } else {
          // No special handling, just use the value.
          *currp = curr->value;
        }
      } else {
        *currp = Builder(*self->getModule()).makeDrop(curr->value);
      }
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Set, curr->index, currp);
    // if this is a copy, note it
    if (auto* get = self->getCopy(curr)) {
      // add 2 units, so that backedge prioritization can decide ties, but not
      // much more
      self->addCopy(curr->index, get->index);
      self->addCopy(curr->index, get->index);
    }
  }